

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O1

void test_int64(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long in_RAX;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  void *pvVar10;
  void *pvVar11;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  size_t sVar15;
  DIR *__dirp;
  dirent *pdVar16;
  FILE *__stream;
  long lVar17;
  uint extraout_EDX;
  char *__dest;
  ulong uVar18;
  char *pcVar19;
  DIR *__s;
  DIR *__name;
  char *pcVar20;
  DIR *pDVar21;
  DIR *__filename;
  undefined8 uVar22;
  DIR *pDVar23;
  undefined1 *unaff_R13;
  char *pcVar24;
  char *pcVar25;
  void *unaff_R15;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  int64_t i64;
  undefined1 auStack_7298 [8];
  undefined1 auStack_7290 [504];
  ulong uStack_7098;
  DIR *pDStack_7090;
  char *pcStack_7088;
  DIR *pDStack_7080;
  DIR *pDStack_7078;
  int iStack_706c;
  DIR *pDStack_7068;
  stat sStack_7060;
  char acStack_6fd0 [512];
  size_t sStack_6dd0;
  char *pcStack_6dc8;
  DIR *pDStack_6dc0;
  char *pcStack_6db8;
  code *pcStack_6db0;
  char *pcStack_6da8;
  ulong uStack_6da0;
  char *pcStack_6d98;
  DIR *pDStack_6d90;
  undefined8 *puStack_6d88;
  undefined8 uStack_6d50;
  undefined1 *puStack_6d48;
  undefined1 *puStack_6d40;
  undefined1 auStack_6d30 [8];
  char *pcStack_6d28;
  undefined8 uStack_6d18;
  char *pcStack_6d10;
  undefined8 uStack_6d08;
  undefined8 uStack_6cf0;
  DIR aDStack_6c80 [25944];
  char *pcStack_728;
  char *pcStack_720;
  char *pcStack_718;
  char *pcStack_710;
  code *apcStack_708 [2];
  undefined1 auStack_6f8 [116];
  uint uStack_684;
  char acStack_680 [256];
  undefined8 uStack_580;
  char *pcStack_578;
  char *pcStack_570;
  char *pcStack_568;
  char *pcStack_560;
  char *pcStack_558;
  char *pcStack_550;
  undefined8 uStack_548;
  code *pcStack_540;
  char *pcStack_538;
  undefined8 uStack_530;
  char *pcStack_528;
  char *pcStack_520;
  char *pcStack_518;
  char *pcStack_510;
  code *pcStack_508;
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  char *pcStack_4f0;
  char *pcStack_4e8;
  char *pcStack_4e0;
  undefined8 uStack_4d8;
  bson_t *pbStack_4d0;
  char *pcStack_4c8;
  code *pcStack_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  char *pcStack_4a0;
  char *pcStack_498;
  char *pcStack_490;
  char *pcStack_488;
  char *pcStack_480;
  code *pcStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  undefined1 *puStack_458;
  char *pcStack_450;
  char *pcStack_448;
  code *pcStack_440;
  undefined8 uStack_438;
  ulong uStack_430;
  ulong uStack_428;
  undefined1 *puStack_420;
  char *pcStack_418;
  void *pvStack_410;
  code *pcStack_408;
  uint uStack_384;
  undefined1 auStack_380 [4];
  uint uStack_37c;
  ulong uStack_230;
  ulong uStack_228;
  undefined1 *puStack_220;
  char *pcStack_218;
  void *pvStack_210;
  code *apcStack_208 [16];
  uint uStack_184;
  undefined1 auStack_180 [4];
  uint uStack_17c;
  undefined8 uStack_78;
  long local_18;
  
  local_18 = in_RAX;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x11,10,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x11,&local_18,0);
  if (cVar1 == '\0') {
    test_int64_cold_1();
  }
  else if (local_18 == 10) {
    bson_destroy(uVar6);
    return;
  }
  test_int64_cold_2();
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x13,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  test_maxkey_cold_1();
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x14,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  test_minkey_cold_1();
  apcStack_208[0] = (code *)0x13bfe3;
  uStack_78 = uVar6;
  uVar8 = bcon_new(0,"bar","baz",0);
  apcStack_208[0] = (code *)0x13bfeb;
  uVar6 = bson_bcon_magic();
  pcVar25 = "foo";
  apcStack_208[0] = (code *)0x13c00c;
  uVar9 = bcon_new(0,"foo",uVar6,2,uVar8,0);
  apcStack_208[0] = (code *)0x13c014;
  uVar6 = bson_bcone_magic();
  apcStack_208[0] = (code *)0x13c034;
  cVar1 = bcon_extract(uVar9,"foo",uVar6,2,auStack_180,0);
  if (cVar1 == '\0') {
LAB_0013c1b7:
    apcStack_208[0] = (code *)0x13c1bc;
    test_bson_document_cold_1();
LAB_0013c1bc:
    apcStack_208[0] = (code *)0x13c1c1;
    test_bson_document_cold_6();
LAB_0013c1c1:
    apcStack_208[0] = (code *)0x13c1c6;
    test_bson_document_cold_5();
LAB_0013c1c6:
    apcStack_208[0] = (code *)0x13c1cb;
    test_bson_document_cold_2();
  }
  else {
    apcStack_208[0] = (code *)0x13c04c;
    unaff_R15 = (void *)bson_get_data(auStack_180);
    apcStack_208[0] = (code *)0x13c057;
    pcVar25 = (char *)bson_get_data(uVar8);
    if (*(uint *)(uVar8 + 4) == uStack_17c) {
      apcStack_208[0] = (code *)0x13c06b;
      pvVar10 = (void *)bson_get_data(uVar8);
      apcStack_208[0] = (code *)0x13c07b;
      pvVar11 = (void *)bson_get_data(auStack_180);
      apcStack_208[0] = (code *)0x13c089;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar8 + 4));
      if (iVar2 == 0) {
        apcStack_208[0] = (code *)0x13c09a;
        bson_destroy(auStack_180);
        apcStack_208[0] = (code *)0x13c0a2;
        bson_destroy(uVar8);
        apcStack_208[0] = (code *)0x13c0aa;
        bson_destroy(uVar9);
        return;
      }
    }
    unaff_R13 = auStack_180;
    apcStack_208[0] = (code *)0x13c0cb;
    uVar6 = bson_as_canonical_extended_json(unaff_R13);
    apcStack_208[0] = (code *)0x13c0d8;
    uVar7 = bson_as_canonical_extended_json(uVar8);
    uVar9 = 0xffffffff;
    if (uStack_17c != 0) {
      uVar18 = 0;
      do {
        if (*(int *)(uVar8 + 4) == (int)uVar18) break;
        if (*(char *)((long)unaff_R15 + uVar18) != pcVar25[uVar18]) {
          uVar9 = uVar18 & 0xffffffff;
          break;
        }
        uVar18 = uVar18 + 1;
      } while (uStack_17c != (uint)uVar18);
    }
    if ((int)uVar9 == -1) {
      uVar3 = uStack_17c;
      if (uStack_17c < *(uint *)(uVar8 + 4)) {
        uVar3 = *(uint *)(uVar8 + 4);
      }
      uVar9 = (ulong)(uVar3 - 1);
    }
    apcStack_208[0] = (code *)0x13c133;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9,uVar6,uVar7);
    apcStack_208[0] = (code *)0x13c14b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar9 = (ulong)uVar3;
    apcStack_208[0] = (code *)0x13c166;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_184 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c1bc;
    unaff_R13 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c1c1;
    uVar9 = (ulong)uStack_17c;
    apcStack_208[0] = (code *)0x13c190;
    uVar18 = write(uVar3,unaff_R15,uVar9);
    if (uVar18 != uVar9) goto LAB_0013c1c6;
    uVar8 = (ulong)*(uint *)(uVar8 + 4);
    apcStack_208[0] = (code *)0x13c1a6;
    uVar18 = write(uVar4,pcVar25,uVar8);
    if (uVar18 == uVar8) {
      apcStack_208[0] = (code *)0x13c1b7;
      test_bson_document_cold_4();
      goto LAB_0013c1b7;
    }
  }
  apcStack_208[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_408 = (code *)0x13c201;
  uStack_230 = uVar8;
  uStack_228 = uVar9;
  puStack_220 = unaff_R13;
  pcStack_218 = pcVar25;
  pvStack_210 = unaff_R15;
  apcStack_208[0] = (code *)&stack0xffffffffffffffb0;
  uVar8 = bcon_new(0,"0","baz",0);
  pcStack_408 = (code *)0x13c209;
  uVar6 = bson_bcon_magic();
  pcVar25 = "foo";
  pcStack_408 = (code *)0x13c22a;
  uVar9 = bcon_new(0,"foo",uVar6,3,uVar8,0);
  pcStack_408 = (code *)0x13c232;
  uVar6 = bson_bcone_magic();
  pcStack_408 = (code *)0x13c252;
  cVar1 = bcon_extract(uVar9,"foo",uVar6,3,auStack_380,0);
  if (cVar1 == '\0') {
LAB_0013c3d5:
    pcStack_408 = (code *)0x13c3da;
    test_bson_array_cold_1();
LAB_0013c3da:
    pcStack_408 = (code *)0x13c3df;
    test_bson_array_cold_6();
LAB_0013c3df:
    pcStack_408 = (code *)0x13c3e4;
    test_bson_array_cold_5();
LAB_0013c3e4:
    pcStack_408 = (code *)0x13c3e9;
    test_bson_array_cold_2();
  }
  else {
    pcStack_408 = (code *)0x13c26a;
    unaff_R15 = (void *)bson_get_data(auStack_380);
    pcStack_408 = (code *)0x13c275;
    pcVar25 = (char *)bson_get_data(uVar8);
    if (*(uint *)(uVar8 + 4) == uStack_37c) {
      pcStack_408 = (code *)0x13c289;
      pvVar10 = (void *)bson_get_data(uVar8);
      pcStack_408 = (code *)0x13c299;
      pvVar11 = (void *)bson_get_data(auStack_380);
      pcStack_408 = (code *)0x13c2a7;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar8 + 4));
      if (iVar2 == 0) {
        pcStack_408 = (code *)0x13c2b8;
        bson_destroy(auStack_380);
        pcStack_408 = (code *)0x13c2c0;
        bson_destroy(uVar8);
        pcStack_408 = (code *)0x13c2c8;
        bson_destroy(uVar9);
        return;
      }
    }
    unaff_R13 = auStack_380;
    pcStack_408 = (code *)0x13c2e9;
    uVar6 = bson_as_canonical_extended_json(unaff_R13);
    pcStack_408 = (code *)0x13c2f6;
    uVar7 = bson_as_canonical_extended_json(uVar8);
    uVar9 = 0xffffffff;
    if (uStack_37c != 0) {
      uVar18 = 0;
      do {
        if (*(int *)(uVar8 + 4) == (int)uVar18) break;
        if (*(char *)((long)unaff_R15 + uVar18) != pcVar25[uVar18]) {
          uVar9 = uVar18 & 0xffffffff;
          break;
        }
        uVar18 = uVar18 + 1;
      } while (uStack_37c != (uint)uVar18);
    }
    if ((int)uVar9 == -1) {
      uVar3 = uStack_37c;
      if (uStack_37c < *(uint *)(uVar8 + 4)) {
        uVar3 = *(uint *)(uVar8 + 4);
      }
      uVar9 = (ulong)(uVar3 - 1);
    }
    pcStack_408 = (code *)0x13c351;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9,uVar6,uVar7);
    pcStack_408 = (code *)0x13c369;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar9 = (ulong)uVar3;
    pcStack_408 = (code *)0x13c384;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_384 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c3da;
    unaff_R13 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c3df;
    uVar9 = (ulong)uStack_37c;
    pcStack_408 = (code *)0x13c3ae;
    uVar18 = write(uVar3,unaff_R15,uVar9);
    if (uVar18 != uVar9) goto LAB_0013c3e4;
    uVar8 = (ulong)*(uint *)(uVar8 + 4);
    pcStack_408 = (code *)0x13c3c4;
    uVar18 = write(uVar4,pcVar25,uVar8);
    if (uVar18 == uVar8) {
      pcStack_408 = (code *)0x13c3d5;
      test_bson_array_cold_4();
      goto LAB_0013c3d5;
    }
  }
  pcStack_408 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_440 = (code *)0x13c3fe;
  uStack_438 = extraout_RAX;
  uStack_430 = uVar8;
  uStack_428 = uVar9;
  puStack_420 = unaff_R13;
  pcStack_418 = pcVar25;
  pvStack_410 = unaff_R15;
  pcStack_408 = (code *)apcStack_208;
  uStack_468 = bson_bcon_magic();
  pcStack_448 = (char *)0x0;
  pcStack_450 = "]";
  puStack_458 = (undefined1 *)0x2;
  uStack_460 = 0xf;
  uStack_470 = 0x13c446;
  uVar6 = bcon_new(0,"foo","[",uStack_468,0xf,1);
  pcStack_440 = (code *)0x13c452;
  uStack_468 = bson_bcone_magic();
  pcStack_448 = (char *)0x0;
  pcStack_450 = "]";
  uStack_460 = 0xf;
  uStack_470 = 0x13c481;
  puStack_458 = (undefined1 *)&uStack_438;
  cVar1 = bcon_extract(uVar6,"foo","[",uStack_468,0xf,(long)&uStack_438 + 4);
  if (cVar1 == '\0') {
    pcStack_440 = (code *)0x13c4b2;
    test_inline_array_cold_1();
LAB_0013c4b2:
    pcStack_440 = (code *)0x13c4b7;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_438._4_4_ != 1) goto LAB_0013c4b2;
    if ((int)uStack_438 == 2) {
      pcStack_440 = (code *)0x13c49e;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_440 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_440 = (code *)0x147feb;
  pcStack_448 = "[";
  pcStack_450 = "foo";
  puStack_458 = (undefined1 *)0x0;
  uStack_460 = 0xf;
  pcStack_478 = (code *)0x13c4cc;
  uStack_470 = extraout_RAX_00;
  uStack_468 = uVar6;
  pcStack_4a0 = (char *)bson_bcon_magic();
  pcStack_480 = (char *)0x0;
  pcStack_488 = "}";
  pcStack_490 = (char *)0x1;
  pcStack_498 = (char *)0xf;
  uStack_4a8 = "a";
  uStack_4b0 = 2;
  uStack_4b8 = 0x13c51f;
  uVar6 = bcon_new(0,"foo","{","b",pcStack_4a0,0xf);
  pcStack_478 = (code *)0x13c52b;
  pcStack_4a0 = (char *)bson_bcone_magic();
  uStack_4b0 = (long)&uStack_470 + 4;
  pcStack_480 = (char *)0x0;
  pcStack_488 = "}";
  pcStack_498 = (char *)0xf;
  uStack_4a8 = "b";
  uStack_4b8 = 0x13c56e;
  pcStack_490 = (char *)&uStack_470;
  cVar1 = bcon_extract(uVar6,"foo","{","a",pcStack_4a0,0xf);
  if (cVar1 == '\0') {
    pcStack_478 = (code *)0x13c59f;
    test_inline_doc_cold_1();
LAB_0013c59f:
    pcStack_478 = (code *)0x13c5a4;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_470._4_4_ != 1) goto LAB_0013c59f;
    if ((int)uStack_470 == 2) {
      pcStack_478 = (code *)0x13c58b;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_478 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_478 = (code *)0x0;
  pcStack_480 = "a";
  pcStack_490 = "{";
  pcStack_498 = "foo";
  pcStack_4a0 = "}";
  pcStack_4c0 = (code *)0x13c5bc;
  pcStack_488 = (char *)uVar6;
  uStack_4f8 = (undefined8 *)bson_bcon_magic();
  pcStack_4c0 = (code *)0x0;
  pcStack_4c8 = (char *)0x3;
  pbStack_4d0 = (bson_t *)0xf;
  pcStack_4e0 = "c";
  pcStack_4e8 = (char *)0x2;
  pcStack_4f0 = (char *)0xf;
  uStack_500 = 0x13c5fe;
  uStack_4d8 = uStack_4f8;
  bson = (bson_t *)bcon_new(0,"a",uStack_4f8,0xf,1,"b");
  pcStack_4c0 = (code *)0x13c60a;
  pcStack_508 = (code *)bson_bcone_magic();
  pbStack_4d0 = (bson_t *)((long)&uStack_4b0 + 4);
  uStack_4f8 = &uStack_4a8;
  pcStack_4c8 = (char *)0x0;
  uStack_4d8 = 0xf;
  pcStack_4e8 = "c";
  pcStack_4f0 = (char *)0x0;
  uStack_500 = 0xf;
  pcStack_510 = "b";
  pcStack_518 = (char *)0x0;
  pcStack_520 = (char *)0x13c656;
  pcStack_4e0 = (char *)pcStack_508;
  test_extract_ctx_helper(bson,3,"a",pcStack_508,0xf,(long)&uStack_4a8 + 4);
  if (uStack_4a8._4_4_ == 1) {
    if ((int)uStack_4a8 != 2) goto LAB_0013c68b;
    if (uStack_4b0._4_4_ == 3) {
      pcStack_4c0 = (code *)0x13c677;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_4c0 = (code *)0x13c68b;
    test_extract_ctx_cold_1();
LAB_0013c68b:
    pcStack_4c0 = (code *)0x13c690;
    test_extract_ctx_cold_2();
  }
  pcStack_4c0 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_4c0 = (code *)0xf;
  pcStack_4c8 = "a";
  uStack_4d8 = 0;
  pcStack_4e8 = "c";
  pcStack_508 = (code *)0x13c6a8;
  pcStack_4e0 = (char *)((long)&uStack_4a8 + 4);
  pbStack_4d0 = bson;
  uStack_530 = bson_bcon_magic();
  pcStack_510 = (char *)0x0;
  pcStack_518 = "}";
  pcStack_520 = (char *)0xa;
  pcStack_528 = (char *)0xf;
  pcStack_538 = (char *)0x13c6fd;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_508 = (code *)0x13c709;
  uStack_530 = bson_bcone_magic();
  pcStack_520 = (char *)((long)&uStack_4f8 + 4);
  pcStack_510 = (char *)0x0;
  pcStack_518 = "}";
  pcStack_528 = (char *)0xf;
  pcStack_538 = "bar";
  pcStack_540 = (code *)0x13f9a8;
  uStack_548 = 0x13c745;
  cVar1 = bcon_extract(uVar6,"hello",uStack_530,0,&pcStack_4f0,"foo");
  if (cVar1 == '\0') {
    pcStack_508 = (code *)0x13c785;
    test_nested_cold_1();
LAB_0013c785:
    pcStack_508 = (code *)0x13c78a;
    test_nested_cold_2();
  }
  else {
    pcStack_508 = (code *)0x13c75e;
    iVar2 = strcmp("world",pcStack_4f0);
    if (iVar2 != 0) goto LAB_0013c785;
    if (uStack_4f8._4_4_ == 10) {
      pcStack_508 = (code *)0x13c771;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_508 = test_skip;
  test_nested_cold_3();
  pcStack_508 = (code *)0x148ce7;
  pcStack_510 = "bar";
  pcStack_518 = (char *)0x0;
  pcStack_520 = "hello";
  pcStack_528 = "foo";
  pcStack_540 = (code *)0x13c79f;
  uStack_530 = uVar6;
  pcStack_568 = (char *)bson_bcon_magic();
  uStack_548 = 0;
  pcStack_550 = "}";
  pcStack_558 = (char *)0xa;
  pcStack_560 = (char *)0xf;
  pcStack_570 = (char *)0x13c7f2;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_540 = (code *)0x13c7fe;
  pcVar25 = (char *)bson_bcone_magic();
  pcVar24 = "}";
  uStack_548 = 0;
  pcStack_550 = "}";
  pcStack_558 = (char *)0x10;
  pcStack_560 = (char *)0x1c;
  pcStack_570 = "bar";
  pcStack_578 = "{";
  uStack_580 = 0x13c83a;
  pcStack_568 = pcVar25;
  cVar1 = bcon_extract(uVar6,"hello",pcVar25,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_540 = (code *)0x13c89c;
    test_skip_cold_1();
  }
  else {
    uStack_548 = 0;
    pcStack_550 = "}";
    pcStack_558 = (char *)0x12;
    pcStack_560 = (char *)0x1c;
    pcStack_570 = "bar";
    pcStack_578 = "{";
    uStack_580 = 0x13c879;
    pcStack_568 = pcVar25;
    cVar1 = bcon_extract(uVar6,"hello",pcVar25,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_540 = test_iter;
  test_skip_cold_2();
  pcStack_540 = (code *)0x14c89e;
  pcStack_550 = "bar";
  pcStack_558 = "}";
  pcStack_568 = "{";
  apcStack_708[0] = (code *)0x13c8be;
  pcStack_560 = pcVar25;
  uStack_548 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_708[0] = (code *)0x13c8e5;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_708[0] = (code *)0x13c8ed;
  uVar6 = bson_bcone_magic();
  pcVar12 = acStack_680;
  pcVar19 = "foo";
  uVar7 = 0x1d;
  uVar22 = 0;
  apcStack_708[0] = (code *)0x13c90d;
  pcVar20 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  uVar6 = extraout_XMM1_Qa;
  if (cVar1 == '\0') {
LAB_0013cabc:
    apcStack_708[0] = (code *)0x13cac1;
    test_iter_cold_1();
LAB_0013cac1:
    apcStack_708[0] = (code *)0x13cac6;
    test_iter_cold_2();
LAB_0013cac6:
    apcStack_708[0] = (code *)0x13cacb;
    test_iter_cold_3();
LAB_0013cacb:
    apcStack_708[0] = (code *)0x13cad0;
    test_iter_cold_8();
LAB_0013cad0:
    apcStack_708[0] = (code *)0x13cad5;
    test_iter_cold_7();
  }
  else {
    pcVar20 = acStack_680;
    apcStack_708[0] = (code *)0x13c922;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013cac1;
    pcVar20 = acStack_680;
    apcStack_708[0] = (code *)0x13c938;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 != 10) goto LAB_0013cac6;
    uVar22 = 0;
    apcStack_708[0] = (code *)0x13c964;
    __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_680);
    apcStack_708[0] = (code *)0x13c96f;
    pcVar25 = (char *)bson_get_data(__n_00);
    apcStack_708[0] = (code *)0x13c97a;
    __buf = (char *)bson_get_data(__n);
    if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
      apcStack_708[0] = (code *)0x13c98e;
      pvVar10 = (void *)bson_get_data(__n);
      apcStack_708[0] = (code *)0x13c999;
      pvVar11 = (void *)bson_get_data(__n_00);
      apcStack_708[0] = (code *)0x13c9a7;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        apcStack_708[0] = (code *)0x13c9b3;
        bson_destroy(__n);
        apcStack_708[0] = (code *)0x13c9bb;
        bson_destroy(__n_00);
        return;
      }
    }
    apcStack_708[0] = (code *)0x13c9d4;
    uVar7 = bson_as_canonical_extended_json(__n_00);
    apcStack_708[0] = (code *)0x13c9e1;
    pcVar12 = (char *)bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n_00 + 4);
    uVar8 = 0xffffffff;
    if (uVar3 != 0) {
      uVar9 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar9) break;
        if (pcVar25[uVar9] != __buf[uVar9]) {
          uVar8 = uVar9 & 0xffffffff;
          break;
        }
        uVar9 = uVar9 + 1;
      } while (uVar3 != (uint)uVar9);
    }
    if ((int)uVar8 == -1) {
      if (uVar3 < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar8 = (ulong)(uVar3 - 1);
    }
    apcStack_708[0] = (code *)0x13ca3c;
    uVar6 = extraout_XMM1_Qa_02;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8);
    apcStack_708[0] = (code *)0x13ca54;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar24 = (char *)(ulong)uVar3;
    pcVar20 = "failure.expected.bson";
    pcVar19 = (char *)0x42;
    apcStack_708[0] = (code *)0x13ca6f;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_684 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013cacb;
    if (uVar4 == 0xffffffff) goto LAB_0013cad0;
    pcVar24 = (char *)(ulong)uVar4;
    __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
    pcVar20 = (char *)(ulong)uVar3;
    apcStack_708[0] = (code *)0x13ca95;
    pcVar19 = pcVar25;
    pcVar13 = (char *)write(uVar3,pcVar25,(size_t)__n_00);
    if (pcVar13 == __n_00) {
      __n = (char *)(ulong)*(uint *)(__n + 4);
      apcStack_708[0] = (code *)0x13caab;
      pcVar19 = __buf;
      pcVar20 = pcVar24;
      pcVar13 = (char *)write(uVar4,__buf,(size_t)__n);
      if (pcVar13 != __n) goto LAB_0013cada;
      pcVar20 = (char *)(ulong)uStack_684;
      pcVar19 = (char *)(ulong)uVar4;
      apcStack_708[0] = (code *)0x13cabc;
      test_iter_cold_6();
      goto LAB_0013cabc;
    }
  }
  apcStack_708[0] = (code *)0x13cada;
  test_iter_cold_4();
LAB_0013cada:
  apcStack_708[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6d40 = auStack_6d30;
  if (extraout_AL != '\0') {
    uStack_6cf0 = uVar6;
  }
  puStack_6d88 = (undefined8 *)0x13cb62;
  pcStack_6d28 = pcVar19;
  uStack_6d18 = uVar7;
  pcStack_6d10 = pcVar12;
  uStack_6d08 = uVar22;
  pcStack_728 = __n;
  pcStack_720 = pcVar25;
  pcStack_718 = __buf;
  pcStack_710 = __n_00;
  apcStack_708[0] = (code *)&pcStack_540;
  bcon_extract_ctx_init(aDStack_6c80);
  puStack_6d48 = auStack_6f8;
  uStack_6d50 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_6d28) {
    uVar3 = (uint)pcStack_6d28;
    do {
      puStack_6d88 = (undefined8 *)0x13cbce;
      __s = aDStack_6c80;
      pcVar25 = pcVar20;
      cVar1 = bcon_extract_ctx_va(pcVar20,aDStack_6c80,&uStack_6d50);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        puStack_6d88 = (undefined8 *)0x13cbe9;
        test_extract_ctx_helper_cold_1();
        pcStack_6db0 = (code *)0x13cc03;
        __name = __s;
        pcStack_6da8 = pcVar20;
        uStack_6da0 = (ulong)uVar3;
        pcStack_6d98 = pcVar24;
        pDStack_6d90 = aDStack_6c80;
        puStack_6d88 = &uStack_6d50;
        pcVar24 = (char *)strlen(pcVar25);
        pcStack_6db0 = (code *)0x13cc0e;
        pDVar21 = __s;
        sVar14 = strlen((char *)__s);
        if ((int)sVar14 + (int)pcVar24 < 499) {
          pcStack_6db0 = (code *)0x13cc2a;
          memset(__dest,0,500);
          pcStack_6db0 = (code *)0x13cc38;
          strncat(__dest,pcVar25,(long)(int)pcVar24);
          pcStack_6db0 = (code *)0x13cc40;
          sVar15 = strlen(__dest);
          (__dest + sVar15)[0] = '/';
          (__dest + sVar15)[1] = '\0';
          pcStack_6db0 = (code *)0x13cc54;
          strncat(__dest,(char *)__s,(long)(int)sVar14);
          pcVar25 = __dest;
          do {
            if (*pcVar25 == '\\') {
              *pcVar25 = '/';
            }
            else if (*pcVar25 == '\0') {
              return;
            }
            pcVar25 = pcVar25 + 1;
          } while( true );
        }
        pcStack_6db0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar8 = (ulong)extraout_EDX;
        pDStack_7078 = (DIR *)0x13cc9e;
        __filename = __name;
        iStack_706c = iVar2;
        sStack_6dd0 = sVar14;
        pcStack_6dc8 = pcVar24;
        pDStack_6dc0 = __s;
        pcStack_6db8 = pcVar25;
        pcStack_6db0 = (code *)apcStack_708;
        __dirp = opendir((char *)__name);
        pDVar23 = pDVar21;
        pDStack_7080 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013cdc9;
        pDStack_7078 = (DIR *)0x13ccb2;
        __filename = __dirp;
        pdVar16 = readdir(__dirp);
        if (pdVar16 == (dirent *)0x0) goto LAB_0013cda8;
        pcVar24 = "..";
        pDVar23 = (DIR *)0x147699;
        pDStack_7068 = pDVar21;
        goto LAB_0013ccd1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
LAB_0013cd12:
  pDStack_7078 = (DIR *)0x13cd25;
  assemble_path((char *)__name,pcVar25,acStack_6fd0);
  pDStack_7078 = (DIR *)0x13cd32;
  iVar5 = stat(pcVar25,&sStack_7060);
  if ((iVar5 == 0) && ((sStack_7060.st_mode & 0xf000) == 0x4000)) {
    pDStack_7078 = (DIR *)0x13cd60;
    uVar3 = collect_tests_from_dir((char (*) [500])pDStack_7068,acStack_6fd0,iVar2,iStack_706c);
    uVar8 = (ulong)uVar3;
  }
  else {
    pDStack_7078 = (DIR *)0x13cd73;
    pcVar12 = strstr(pcVar25,".json");
    if (pcVar12 != (char *)0x0) {
      uVar8 = (ulong)(iVar2 + 1);
      pDStack_7078 = (DIR *)0x13cd94;
      assemble_path((char *)__name,pcVar25,(char *)(pDStack_7068 + (long)iVar2 * 500));
    }
  }
  pDStack_7078 = (DIR *)0x13cd9c;
  __filename = __dirp;
  pdVar16 = readdir(__dirp);
  if (pdVar16 == (dirent *)0x0) {
LAB_0013cda8:
    pDStack_7078 = (DIR *)0x13cdb0;
    closedir(__dirp);
    return;
  }
LAB_0013ccd1:
  iVar2 = (int)uVar8;
  if (iVar2 < iStack_706c) {
    do {
      pcVar25 = pdVar16->d_name;
      pDStack_7078 = (DIR *)0x13ccea;
      iVar5 = strcmp(pcVar25,"..");
      if (iVar5 != 0) {
        pDStack_7078 = (DIR *)0x13ccf9;
        iVar5 = strcmp(pcVar25,".");
        if (iVar5 != 0) goto LAB_0013cd12;
      }
      pDStack_7078 = (DIR *)0x13cd05;
      pdVar16 = readdir(__dirp);
      if (pdVar16 == (dirent *)0x0) goto LAB_0013cda8;
    } while( true );
  }
  pDStack_7078 = (DIR *)0x13cdc9;
  collect_tests_from_dir_cold_1();
  pDStack_7080 = __dirp;
LAB_0013cdc9:
  pDStack_7078 = (DIR *)get_bson_from_json_file;
  collect_tests_from_dir_cold_2();
  uStack_7098 = uVar8;
  pDStack_7090 = pDVar23;
  pcStack_7088 = pcVar24;
  pDStack_7078 = __name;
  __stream = fopen((char *)__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar14 = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < (long)sVar14) {
      pvVar10 = (void *)bson_malloc0(sVar14);
      sVar15 = fread(pvVar10,1,sVar14,__stream);
      if (sVar15 != sVar14) {
        abort();
      }
      fclose(__stream);
      if (pvVar10 != (void *)0x0) {
        lVar17 = bson_new_from_json(pvVar10,sVar14,auStack_7298);
        if (lVar17 == 0) {
          fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7290);
          abort();
        }
        bson_free(pvVar10);
      }
    }
  }
  return;
}

Assistant:

static void
test_int64 (void)
{
   int64_t i64;

   bson_t *bcon = BCON_NEW ("foo", BCON_INT64 (10));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_INT64 (i64)));

   BSON_ASSERT (i64 == 10);

   bson_destroy (bcon);
}